

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

void __thiscall parser::memo::any::of<hwl::Variable>::~of(of<hwl::Variable> *this)

{
  Variable *in_RDI;
  
  *(undefined ***)&in_RDI->name = &PTR__of_002289a8;
  hwl::Variable::~Variable(in_RDI);
  dyn::~dyn((dyn *)in_RDI);
  return;
}

Assistant:

of (const T& v) : v(v) {}